

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_TogetherInt_Test::~TApp_TogetherInt_Test(TApp_TogetherInt_Test *this)

{
  TApp_TogetherInt_Test *this_local;
  
  ~TApp_TogetherInt_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, TogetherInt) {
    int i;
    app.add_option("-i,--int", i);
    args = {"-i4"};
    run();
    EXPECT_EQ((size_t)1, app.count("--int"));
    EXPECT_EQ((size_t)1, app.count("-i"));
    EXPECT_EQ(i, 4);
}